

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluTextureTestUtil.cpp
# Opt level: O0

Texture3DView glu::TextureTestUtil::getSubView(Texture3DView *view,int baseLevel,int maxLevel)

{
  int iVar1;
  int iVar2;
  ConstPixelBufferAccess *pCVar3;
  Texture3DView TVar4;
  int numLevels;
  int clampedMax;
  int clampedBase;
  int maxLevel_local;
  int baseLevel_local;
  Texture3DView *view_local;
  ConstPixelBufferAccess *local_10;
  
  iVar1 = tcu::Texture3DView::getNumLevels(view);
  iVar1 = de::clamp<int>(baseLevel,0,iVar1 + -1);
  iVar2 = tcu::Texture3DView::getNumLevels(view);
  iVar2 = de::clamp<int>(maxLevel,iVar1,iVar2 + -1);
  pCVar3 = tcu::Texture3DView::getLevels(view);
  tcu::Texture3DView::Texture3DView((Texture3DView *)&view_local,(iVar2 - iVar1) + 1,pCVar3 + iVar1)
  ;
  TVar4._4_4_ = 0;
  TVar4.m_numLevels = (uint)view_local;
  TVar4.m_levels = local_10;
  return TVar4;
}

Assistant:

static tcu::Texture3DView getSubView (const tcu::Texture3DView& view, int baseLevel, int maxLevel)
{
	const int	clampedBase	= de::clamp(baseLevel, 0, view.getNumLevels()-1);
	const int	clampedMax	= de::clamp(maxLevel, clampedBase, view.getNumLevels()-1);
	const int	numLevels	= clampedMax-clampedBase+1;
	return tcu::Texture3DView(numLevels, view.getLevels()+clampedBase);
}